

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O3

void deqp::gles31::Functional::anon_unknown_0::generateUniformMatrixStrideCaseBlockContentCases
               (Context *context,SharedPtr *parentStructure,TestCaseGroup *targetGroup,
               bool extendedBasicTypeCases,bool opaqueCases)

{
  MatrixOrder MVar1;
  SharedPtrStateBase *pSVar2;
  ProgramInterface PVar3;
  TestNode *node;
  TestNode *pTVar4;
  Node *pNVar5;
  SharedPtrStateBase *pSVar6;
  deInt32 *pdVar7;
  int iVar8;
  long lVar9;
  SharedPtr subStructure;
  ProgramResourceQueryTestTarget queryTarget;
  Layout layout;
  undefined4 uStack_4c;
  
  ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
            (&queryTarget,PROGRAMINTERFACE_UNIFORM,0x80);
  lVar9 = 8;
  do {
    MVar1 = *(MatrixOrder *)
             ((long)&generateUniformMatrixStrideCaseBlockContentCases::qualifiers[0].name + lVar9);
    subStructure.m_ptr = parentStructure->m_ptr;
    if ((MVar1 == MATRIXORDER_LAST) || ((subStructure.m_ptr)->m_type == TYPE_INTERFACE_BLOCK)) {
      subStructure.m_state = parentStructure->m_state;
      if (subStructure.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        (subStructure.m_state)->strongRefCount = (subStructure.m_state)->strongRefCount + 1;
        UNLOCK();
        LOCK();
        (subStructure.m_state)->weakRefCount = (subStructure.m_state)->weakRefCount + 1;
        UNLOCK();
      }
      node = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)node,context->m_testCtx,
                 *(char **)((long)&generateUniformMatrixOrderCaseBlockContentCases::qualifiers[2].
                                   order + lVar9),SSBOArrayLengthTests::init::arraysSized + 1);
      tcu::TestNode::addChild(&targetGroup->super_TestNode,node);
      if (MVar1 == MATRIXORDER_LAST) {
        if (extendedBasicTypeCases) {
          pTVar4 = (TestNode *)operator_new(0x70);
          tcu::TestCaseGroup::TestCaseGroup
                    ((TestCaseGroup *)pTVar4,context->m_testCtx,"types",
                     SSBOArrayLengthTests::init::arraysSized + 1);
          tcu::TestNode::addChild(node,pTVar4);
          iVar8 = 0;
          generateVariableCases(context,&subStructure,(TestCaseGroup *)pTVar4,&queryTarget,1,false);
          generateMatrixVariableCases
                    (context,&subStructure,(TestCaseGroup *)pTVar4,&queryTarget,false,iVar8);
          if (opaqueCases) {
            generateOpaqueTypeCases
                      (context,&subStructure,(TestCaseGroup *)pTVar4,&queryTarget,2,false);
          }
          goto LAB_0052286a;
        }
LAB_005228ee:
        PVar3 = queryTarget.interface;
        layout._0_8_ = &layout.matrixOrder;
        std::__cxx11::string::_M_construct<char_const*>((string *)&layout,0x96985f);
        generateBufferBackedVariableAggregateTypeCases
                  (context,&subStructure,(TestCaseGroup *)node,PVar3,
                   PROGRAMRESOURCEPROP_MATRIX_ROW_MAJOR,TYPE_FLOAT_MAT3X2,(string *)&layout,1);
      }
      else {
        iVar8 = 2;
        glu::Layout::Layout(&layout,-1,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
        layout.matrixOrder = MVar1;
        pNVar5 = (Node *)operator_new(0x38);
        pNVar5->_vptr_Node = (_func_int **)&PTR__Node_00b34b08;
        pNVar5->m_type = TYPE_LAYOUT_QUALIFIER;
        (pNVar5->m_enclosingNode).m_ptr = subStructure.m_ptr;
        (pNVar5->m_enclosingNode).m_state = subStructure.m_state;
        if (subStructure.m_state != (SharedPtrStateBase *)0x0) {
          LOCK();
          (subStructure.m_state)->strongRefCount = (subStructure.m_state)->strongRefCount + 1;
          UNLOCK();
          LOCK();
          pdVar7 = &((pNVar5->m_enclosingNode).m_state)->weakRefCount;
          *pdVar7 = *pdVar7 + 1;
          UNLOCK();
        }
        pNVar5->_vptr_Node = (_func_int **)&PTR__Node_00b34da0;
        pNVar5[1]._vptr_Node = (_func_int **)layout._0_8_;
        pNVar5[1].m_type = layout.offset;
        *(FormatLayout *)&pNVar5[1].field_0xc = layout.format;
        *(MatrixOrder *)&pNVar5[1].m_enclosingNode.m_ptr = layout.matrixOrder;
        pSVar6 = (SharedPtrStateBase *)operator_new(0x20);
        pSVar2 = subStructure.m_state;
        pSVar6->strongRefCount = 0;
        pSVar6->weakRefCount = 0;
        pSVar6->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b34b28;
        pSVar6[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar5;
        pSVar6->strongRefCount = 1;
        pSVar6->weakRefCount = 1;
        if (subStructure.m_state != pSVar6) {
          if (subStructure.m_state != (SharedPtrStateBase *)0x0) {
            LOCK();
            pdVar7 = &(subStructure.m_state)->strongRefCount;
            *pdVar7 = *pdVar7 + -1;
            UNLOCK();
            if (*pdVar7 == 0) {
              subStructure.m_ptr = (Node *)0x0;
              (*(subStructure.m_state)->_vptr_SharedPtrStateBase[2])(subStructure.m_state);
            }
            LOCK();
            pdVar7 = &pSVar2->weakRefCount;
            *pdVar7 = *pdVar7 + -1;
            UNLOCK();
            if ((*pdVar7 == 0) && (subStructure.m_state != (SharedPtrStateBase *)0x0)) {
              (*(subStructure.m_state)->_vptr_SharedPtrStateBase[1])();
            }
          }
          LOCK();
          pSVar6->strongRefCount = pSVar6->strongRefCount + 1;
          UNLOCK();
          LOCK();
          pSVar6->weakRefCount = pSVar6->weakRefCount + 1;
          UNLOCK();
          subStructure.m_ptr = pNVar5;
          subStructure.m_state = pSVar6;
        }
        pdVar7 = &pSVar6->strongRefCount;
        LOCK();
        *pdVar7 = *pdVar7 + -1;
        UNLOCK();
        if (*pdVar7 == 0) {
          (*pSVar6->_vptr_SharedPtrStateBase[2])(pSVar6);
        }
        pdVar7 = &pSVar6->weakRefCount;
        LOCK();
        *pdVar7 = *pdVar7 + -1;
        UNLOCK();
        if (*pdVar7 == 0) {
          (*pSVar6->_vptr_SharedPtrStateBase[1])(pSVar6);
        }
        if (!extendedBasicTypeCases) goto LAB_005228ee;
        generateMatrixVariableCases
                  (context,&subStructure,(TestCaseGroup *)node,&queryTarget,true,iVar8);
LAB_0052286a:
        pTVar4 = (TestNode *)operator_new(0x70);
        tcu::TestCaseGroup::TestCaseGroup
                  ((TestCaseGroup *)pTVar4,context->m_testCtx,"aggregates",
                   SSBOArrayLengthTests::init::arraysSized + 1);
        tcu::TestNode::addChild(node,pTVar4);
        PVar3 = queryTarget.interface;
        layout._0_8_ = &layout.matrixOrder;
        std::__cxx11::string::_M_construct<char_const*>((string *)&layout,0x96985f);
        generateBufferBackedVariableAggregateTypeCases
                  (context,&subStructure,(TestCaseGroup *)pTVar4,PVar3,
                   PROGRAMRESOURCEPROP_MATRIX_ROW_MAJOR,TYPE_FLOAT_MAT3X2,(string *)&layout,1);
      }
      if ((MatrixOrder *)layout._0_8_ != &layout.matrixOrder) {
        operator_delete((void *)layout._0_8_,CONCAT44(uStack_4c,layout.matrixOrder) + 1);
      }
      pSVar2 = subStructure.m_state;
      if (subStructure.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        pdVar7 = &(subStructure.m_state)->strongRefCount;
        *pdVar7 = *pdVar7 + -1;
        UNLOCK();
        if (*pdVar7 == 0) {
          subStructure.m_ptr = (Node *)0x0;
          (*(subStructure.m_state)->_vptr_SharedPtrStateBase[2])(subStructure.m_state);
        }
        LOCK();
        pdVar7 = &pSVar2->weakRefCount;
        *pdVar7 = *pdVar7 + -1;
        UNLOCK();
        if ((*pdVar7 == 0) && (subStructure.m_state != (SharedPtrStateBase *)0x0)) {
          (*(subStructure.m_state)->_vptr_SharedPtrStateBase[1])();
        }
      }
    }
    lVar9 = lVar9 + 0x10;
    if (lVar9 == 0x38) {
      return;
    }
  } while( true );
}

Assistant:

static void generateUniformMatrixStrideCaseBlockContentCases (Context& context, const ResourceDefinition::Node::SharedPtr& parentStructure, tcu::TestCaseGroup* const targetGroup, bool extendedBasicTypeCases, bool opaqueCases)
{
	static const struct
	{
		const char*			name;
		glu::MatrixOrder	order;
	} qualifiers[] =
	{
		{ "no_qualifier",	glu::MATRIXORDER_LAST			},
		{ "row_major",		glu::MATRIXORDER_ROW_MAJOR		},
		{ "column_major",	glu::MATRIXORDER_COLUMN_MAJOR	},
	};

	const ProgramResourceQueryTestTarget queryTarget(PROGRAMINTERFACE_UNIFORM, PROGRAMRESOURCEPROP_MATRIX_STRIDE);

	for (int qualifierNdx = 0; qualifierNdx < DE_LENGTH_OF_ARRAY(qualifiers); ++qualifierNdx)
	{
		// Add layout qualifiers only for block members
		if (qualifiers[qualifierNdx].order == glu::MATRIXORDER_LAST || parentStructure->getType() == ResourceDefinition::Node::TYPE_INTERFACE_BLOCK)
		{
			ResourceDefinition::Node::SharedPtr	subStructure	= parentStructure;
			tcu::TestCaseGroup* const			qualifierGroup	= new tcu::TestCaseGroup(context.getTestContext(), qualifiers[qualifierNdx].name, "");

			targetGroup->addChild(qualifierGroup);

			if (qualifiers[qualifierNdx].order != glu::MATRIXORDER_LAST)
			{
				glu::Layout layout;
				layout.matrixOrder = qualifiers[qualifierNdx].order;
				subStructure = ResourceDefinition::Node::SharedPtr(new ResourceDefinition::LayoutQualifier(subStructure, layout));
			}

			if (extendedBasicTypeCases)
			{
				// .types
				// .matrix
				if (qualifiers[qualifierNdx].order == glu::MATRIXORDER_LAST)
				{
					tcu::TestCaseGroup* const blockGroup = new tcu::TestCaseGroup(context.getTestContext(), "types", "");
					qualifierGroup->addChild(blockGroup);

					generateVariableCases(context, subStructure, blockGroup, queryTarget, 1, false);
					generateMatrixVariableCases(context, subStructure, blockGroup, queryTarget, false);
					if (opaqueCases)
						generateOpaqueTypeCases(context, subStructure, blockGroup, queryTarget, 2, false);
				}
				else
					generateMatrixVariableCases(context, subStructure, qualifierGroup, queryTarget);

				// .aggregates
				{
					tcu::TestCaseGroup* const blockGroup = new tcu::TestCaseGroup(context.getTestContext(), "aggregates", "");
					qualifierGroup->addChild(blockGroup);

					generateBufferBackedVariableAggregateTypeCases(context, subStructure, blockGroup, queryTarget.interface, PROGRAMRESOURCEPROP_MATRIX_ROW_MAJOR, glu::TYPE_FLOAT_MAT3X2, "", 1);
				}
			}
			else
				generateBufferBackedVariableAggregateTypeCases(context, subStructure, qualifierGroup, queryTarget.interface, PROGRAMRESOURCEPROP_MATRIX_ROW_MAJOR, glu::TYPE_FLOAT_MAT3X2, "", 1);
		}
	}
}